

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool tinyusdz::ascii::ParseUnregistredValue(string *_typeName,string *str,Value *value,string *err)

{
  _Invoker_type *this;
  value_type_conflict3 vVar1;
  bool bVar2;
  uint8_t *binary;
  uint64_t length;
  value_type_conflict3 *pvVar3;
  allocator local_941;
  string local_940 [32];
  fmt local_920 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_900 [39];
  allocator local_8d9;
  string local_8d8 [32];
  fmt local_8b8 [32];
  undefined1 local_898 [8];
  uint4 val_2;
  allocator local_861;
  string local_860 [32];
  fmt local_840 [32];
  undefined1 local_820 [8];
  vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_> vss_2;
  allocator local_7e1;
  string local_7e0 [32];
  fmt local_7c0 [36];
  undefined1 local_79c [8];
  uint3 val_1;
  allocator local_769;
  string local_768 [32];
  fmt local_748 [32];
  undefined1 local_728 [8];
  vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_> vss_1;
  allocator local_6e9;
  string local_6e8 [32];
  fmt local_6c8 [32];
  uint2 local_6a8;
  uint2 val;
  allocator local_679;
  string local_678 [32];
  fmt local_658 [32];
  undefined1 local_638 [8];
  vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_> vss;
  Value dst;
  AsciiParser parser;
  StreamReader sr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  optional<unsigned_int> local_d4;
  optional<unsigned_int> local_cc;
  optional<unsigned_int> typeId;
  string local_a0;
  allocator local_79;
  string local_78;
  undefined1 local_58 [8];
  string typeName;
  bool array_qual;
  string *err_local;
  Value *value_local;
  string *str_local;
  string *_typeName_local;
  
  if (value == (Value *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator+=((string *)err,"`value` argument is nullptr.\n");
    }
    _typeName_local._7_1_ = 0;
    goto LAB_0063592b;
  }
  typeName.field_2._M_local_buf[0xf] = '\0';
  ::std::__cxx11::string::string((string *)local_58,(string *)_typeName);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_78,"[]",&local_79);
  bVar2 = endsWith((string *)local_58,&local_78);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_79);
  if (bVar2) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&typeId.contained,"[]",(allocator *)&typeId.field_0x3);
    removeSuffix(&local_a0,(string *)local_58,(string *)&typeId.contained);
    ::std::__cxx11::string::operator=((string *)local_58,(string *)&local_a0);
    ::std::__cxx11::string::~string((string *)&local_a0);
    ::std::__cxx11::string::~string((string *)&typeId.contained);
    ::std::allocator<char>::~allocator((allocator<char> *)&typeId.field_0x3);
    typeName.field_2._M_local_buf[0xf] = '\x01';
  }
  tinyusdz::value::TryGetTypeId(&local_d4,(string *)local_58);
  nonstd::optional_lite::optional<unsigned_int>::optional<unsigned_int,_0>(&local_cc,&local_d4);
  nonstd::optional_lite::optional<unsigned_int>::~optional(&local_d4);
  bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_cc);
  if (bVar2) {
    binary = (uint8_t *)::std::__cxx11::string::data();
    length = ::std::__cxx11::string::size();
    this = &parser._primspec_fun._M_invoker;
    StreamReader::StreamReader((StreamReader *)this,binary,length,false);
    AsciiParser::AsciiParser((AsciiParser *)&dst.v_.vtable,(StreamReader *)this);
    tinyusdz::value::Value::Value
              ((Value *)&vss.
                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pvVar3 = nonstd::optional_lite::optional<unsigned_int>::value(&local_cc);
    vVar1 = *pvVar3;
    if (vVar1 == 0x25) {
      if ((typeName.field_2._M_local_buf[0xf] & 1U) == 0) {
        bVar2 = AsciiParser::ReadBasicType((AsciiParser *)&dst.v_.vtable,&local_6a8);
        if (!bVar2) {
          if (err != (string *)0x0) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_6e8,"Failed to parse a value of type `{}`",&local_6e9);
            tinyusdz::value::TypeTraits<std::array<unsigned_int,2ul>>::type_name_abi_cxx11_();
            fmt::format<std::__cxx11::string>
                      (local_6c8,(string *)local_6e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &vss_1.
                        super__Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            ::std::__cxx11::string::operator=((string *)err,(string *)local_6c8);
            ::std::__cxx11::string::~string((string *)local_6c8);
            ::std::__cxx11::string::~string
                      ((string *)
                       &vss_1.
                        super__Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            ::std::__cxx11::string::~string(local_6e8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_6e9);
          }
          _typeName_local._7_1_ = 0;
          goto LAB_006358fe;
        }
        tinyusdz::value::Value::operator=
                  ((Value *)&vss.
                             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_6a8);
      }
      else {
        ::std::
        vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>::
        vector((vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                *)local_638);
        bVar2 = AsciiParser::ParseBasicTypeArray<std::array<unsigned_int,2ul>>
                          ((AsciiParser *)&dst.v_.vtable,
                           (vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                            *)local_638);
        if (bVar2) {
          tinyusdz::value::Value::operator=
                    ((Value *)&vss.
                               super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                      *)local_638);
          bVar2 = false;
        }
        else {
          if (err != (string *)0x0) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_678,"Failed to parse a value of type `{}[]`",&local_679);
            tinyusdz::value::TypeTraits<std::array<unsigned_int,2ul>>::type_name_abi_cxx11_();
            fmt::format<std::__cxx11::string>
                      (local_658,(string *)local_678,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val);
            ::std::__cxx11::string::operator=((string *)err,(string *)local_658);
            ::std::__cxx11::string::~string((string *)local_658);
            ::std::__cxx11::string::~string((string *)&val);
            ::std::__cxx11::string::~string(local_678);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_679);
          }
          _typeName_local._7_1_ = 0;
          bVar2 = true;
        }
        ::std::
        vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>::
        ~vector((vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 *)local_638);
joined_r0x00635388:
        if (bVar2) goto LAB_006358fe;
      }
LAB_006358e0:
      tinyusdz::value::Value::operator=
                (value,(Value *)&vss.
                                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      _typeName_local._7_1_ = 1;
    }
    else if (vVar1 == 0x26) {
      if ((typeName.field_2._M_local_buf[0xf] & 1U) != 0) {
        ::std::
        vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>::
        vector((vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                *)local_728);
        bVar2 = AsciiParser::ParseBasicTypeArray<std::array<unsigned_int,3ul>>
                          ((AsciiParser *)&dst.v_.vtable,
                           (vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                            *)local_728);
        if (bVar2) {
          tinyusdz::value::Value::operator=
                    ((Value *)&vss.
                               super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                      *)local_728);
          bVar2 = false;
        }
        else {
          if (err != (string *)0x0) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_768,"Failed to parse a value of type `{}[]`",&local_769);
            tinyusdz::value::TypeTraits<std::array<unsigned_int,3ul>>::type_name_abi_cxx11_();
            fmt::format<std::__cxx11::string>
                      (local_748,(string *)local_768,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (val_1._M_elems + 1));
            ::std::__cxx11::string::operator=((string *)err,(string *)local_748);
            ::std::__cxx11::string::~string((string *)local_748);
            ::std::__cxx11::string::~string((string *)(val_1._M_elems + 1));
            ::std::__cxx11::string::~string(local_768);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_769);
          }
          _typeName_local._7_1_ = 0;
          bVar2 = true;
        }
        ::std::
        vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>::
        ~vector((vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                 *)local_728);
        goto joined_r0x00635388;
      }
      bVar2 = AsciiParser::ReadBasicType((AsciiParser *)&dst.v_.vtable,(uint3 *)local_79c);
      if (bVar2) {
        tinyusdz::value::Value::operator=
                  ((Value *)&vss.
                             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (array<unsigned_int,_3UL> *)local_79c);
        goto LAB_006358e0;
      }
      if (err != (string *)0x0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_7e0,"Failed to parse a value of type `{}`",&local_7e1);
        tinyusdz::value::TypeTraits<std::array<unsigned_int,3ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>
                  (local_7c0,(string *)local_7e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &vss_2.
                    super__Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::__cxx11::string::operator=((string *)err,(string *)local_7c0);
        ::std::__cxx11::string::~string((string *)local_7c0);
        ::std::__cxx11::string::~string
                  ((string *)
                   &vss_2.
                    super__Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::__cxx11::string::~string(local_7e0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_7e1);
      }
      _typeName_local._7_1_ = 0;
    }
    else if (vVar1 == 0x27) {
      if ((typeName.field_2._M_local_buf[0xf] & 1U) != 0) {
        ::std::
        vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>::
        vector((vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                *)local_820);
        bVar2 = AsciiParser::ParseBasicTypeArray<std::array<unsigned_int,4ul>>
                          ((AsciiParser *)&dst.v_.vtable,
                           (vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                            *)local_820);
        if (bVar2) {
          tinyusdz::value::Value::operator=
                    ((Value *)&vss.
                               super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                      *)local_820);
          bVar2 = false;
        }
        else {
          if (err != (string *)0x0) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_860,"Failed to parse a value of type `{}[]`",&local_861);
            tinyusdz::value::TypeTraits<std::array<unsigned_int,4ul>>::type_name_abi_cxx11_();
            fmt::format<std::__cxx11::string>
                      (local_840,(string *)local_860,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (val_2._M_elems + 2));
            ::std::__cxx11::string::operator=((string *)err,(string *)local_840);
            ::std::__cxx11::string::~string((string *)local_840);
            ::std::__cxx11::string::~string((string *)(val_2._M_elems + 2));
            ::std::__cxx11::string::~string(local_860);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_861);
          }
          _typeName_local._7_1_ = 0;
          bVar2 = true;
        }
        ::std::
        vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>::
        ~vector((vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                 *)local_820);
        goto joined_r0x00635388;
      }
      bVar2 = AsciiParser::ReadBasicType((AsciiParser *)&dst.v_.vtable,(uint4 *)local_898);
      if (bVar2) {
        tinyusdz::value::Value::operator=
                  ((Value *)&vss.
                             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (array<unsigned_int,_4UL> *)local_898);
        goto LAB_006358e0;
      }
      if (err != (string *)0x0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_8d8,"Failed to parse a value of type `{}`",&local_8d9);
        tinyusdz::value::TypeTraits<std::array<unsigned_int,4ul>>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string>(local_8b8,(string *)local_8d8,local_900);
        ::std::__cxx11::string::operator=((string *)err,(string *)local_8b8);
        ::std::__cxx11::string::~string((string *)local_8b8);
        ::std::__cxx11::string::~string((string *)local_900);
        ::std::__cxx11::string::~string(local_8d8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
      }
      _typeName_local._7_1_ = 0;
    }
    else {
      if (err != (string *)0x0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_940,"Unsupported or unimplemeneted type `{}`",&local_941);
        fmt::format<std::__cxx11::string>
                  (local_920,(string *)local_940,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
        ::std::__cxx11::string::operator=((string *)err,(string *)local_920);
        ::std::__cxx11::string::~string((string *)local_920);
        ::std::__cxx11::string::~string(local_940);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_941);
      }
      _typeName_local._7_1_ = 0;
    }
LAB_006358fe:
    tinyusdz::value::Value::~Value
              ((Value *)&vss.
                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    AsciiParser::~AsciiParser((AsciiParser *)&dst.v_.vtable);
  }
  else {
    if (err != (string *)0x0) {
      ::std::operator+((char *)&local_118,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "Unsupported type: ");
      ::std::operator+(&local_f8,&local_118,"\n");
      ::std::__cxx11::string::operator+=((string *)err,(string *)&local_f8);
      ::std::__cxx11::string::~string((string *)&local_f8);
      ::std::__cxx11::string::~string((string *)&local_118);
    }
    _typeName_local._7_1_ = 0;
  }
  nonstd::optional_lite::optional<unsigned_int>::~optional(&local_cc);
  ::std::__cxx11::string::~string((string *)local_58);
LAB_0063592b:
  return (bool)(_typeName_local._7_1_ & 1);
}

Assistant:

bool ParseUnregistredValue(const std::string &_typeName, const std::string &str,
                           value::Value *value, std::string *err) {
  if (!value) {
    if (err) {
      (*err) += "`value` argument is nullptr.\n";
    }
    return false;
  }

  bool array_qual = false;
  std::string typeName = _typeName;
  if (endsWith(typeName, "[]")) {
    typeName = removeSuffix(typeName, "[]");
    array_qual = true;
  }

  nonstd::optional<uint32_t> typeId = value::TryGetTypeId(typeName);

  if (!typeId) {
    if (err) {
      (*err) += "Unsupported type: " + typeName + "\n";
    }
    return false;
  }

  tinyusdz::StreamReader sr(reinterpret_cast<const uint8_t *>(str.data()),
                            str.size(), /* swap endian */ false);
  tinyusdz::ascii::AsciiParser parser(&sr);

#define PARSE_BASE_TYPE(__ty)                                            \
  case value::TypeTraits<__ty>::type_id(): {                             \
    if (array_qual) {                                                    \
      std::vector<__ty> vss;                                             \
      if (!parser.ParseBasicTypeArray(&vss)) {                           \
        if (err) {                                                       \
          (*err) = fmt::format("Failed to parse a value of type `{}[]`", \
                               value::TypeTraits<__ty>::type_name());    \
        }                                                                \
        return false;                                                    \
      }                                                                  \
      dst = vss;                                                         \
    } else {                                                             \
      __ty val;                                                          \
      if (!parser.ReadBasicType(&val)) {                                 \
        if (err) {                                                       \
          (*err) = fmt::format("Failed to parse a value of type `{}`",   \
                               value::TypeTraits<__ty>::type_name());    \
        }                                                                \
        return false;                                                    \
      }                                                                  \
      dst = val;                                                         \
    }                                                                    \
    break;                                                               \
  }

  value::Value dst;

  switch (typeId.value()) {
    PARSE_BASE_TYPE(value::uint2)
    PARSE_BASE_TYPE(value::uint3)
    PARSE_BASE_TYPE(value::uint4)
    default: {
      if (err) {
        (*err) =
            fmt::format("Unsupported or unimplemeneted type `{}`", typeName);
      }
      return false;
    }
  }

  (*value) = std::move(dst);

  return true;
}